

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrElse.cpp
# Opt level: O2

void __thiscall FactoredQLastTimeStepOrElse::Initialize(FactoredQLastTimeStepOrElse *this)

{
  QFunctionForFactoredDecPOMDP *pQVar1;
  ostream *poVar2;
  long lVar3;
  size_t sVar4;
  value_type *__x;
  Index e;
  ulong uVar5;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"FactoredQLastTimeStepOrElse::Initialize()");
  std::endl<char,std::char_traits<char>>(poVar2);
  pQVar1 = &this->super_QFunctionForFactoredDecPOMDP;
  lVar3 = (**(code **)(*(long *)&this->super_QFunctionForFactoredDecPOMDP + 0x78))(pQVar1);
  sVar4 = (**(code **)(**(long **)(lVar3 + 0x338) + 0xf8))();
  this->_m_nrLRFs = sVar4;
  std::vector<Scope,_std::allocator<Scope>_>::clear(&this->_m_agentScopes);
  for (uVar5 = 0; this->_m_nrLRFs != uVar5; uVar5 = (ulong)((int)uVar5 + 1)) {
    lVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1);
    __x = (value_type *)
          (**(code **)(**(long **)(lVar3 + 0x338) + 0x108))(*(long **)(lVar3 + 0x338),uVar5);
    std::vector<Scope,_std::allocator<Scope>_>::push_back(&this->_m_agentScopes,__x);
  }
  this->_m_initialized = true;
  return;
}

Assistant:

void FactoredQLastTimeStepOrElse::Initialize()
{
    cout << "FactoredQLastTimeStepOrElse::Initialize()"<<endl;
    _m_nrLRFs=GetPUF()->GetFDPOMDPD()->GetNrLRFs();
    _m_agentScopes.clear();
    for(Index e=0;e!=_m_nrLRFs;++e)
        _m_agentScopes.push_back(GetPUF()->GetFDPOMDPD()->GetAgentScopeForLRF(e));
    _m_initialized = true;
}